

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  undefined1 uVar1;
  undefined4 in_EDX;
  AssertionReaction *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffeb0;
  AssertionInfo *info_00;
  AssertionResult *this_00;
  OfType in_stack_fffffffffffffecc;
  AssertionResultData *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_ffffffffffffffb8;
  RunContext *in_stack_ffffffffffffffc0;
  
  AssertionInfo::operator=
            ((AssertionInfo *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  info_00 = (AssertionInfo *)&stack0xffffffffffffff78;
  LazyExpression::LazyExpression((LazyExpression *)info_00,false);
  this_00 = (AssertionResult *)&stack0xffffffffffffff88;
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(LazyExpression *)this_00);
  AssertionResult::AssertionResult
            (this_00,info_00,(AssertionResultData *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0));
  assertionEnded(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar1 = AssertionResult::isOk
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  if (!(bool)uVar1) {
    populateReaction((RunContext *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0),in_RDI);
  }
  AssertionResult::~AssertionResult((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffea0));
  AssertionResultData::~AssertionResultData
            ((AssertionResultData *)CONCAT17(uVar1,in_stack_fffffffffffffea0));
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }